

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestTestHandler::CleanTestOutput(cmCTestTestHandler *this,string *output,size_t length)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_220 [48];
  ostringstream local_1f0 [8];
  ostringstream msg;
  string local_78 [32];
  char *local_58;
  char *next;
  char *pcStack_48;
  uint ch;
  char *current;
  char *truncate;
  char *end;
  char *begin;
  size_t length_local;
  string *output_local;
  cmCTestTestHandler *this_local;
  
  if (((length == 0) ||
      (begin = (char *)length, length_local = (size_t)output, output_local = (string *)this,
      uVar1 = std::__cxx11::string::size(), uVar1 <= length)) ||
     (lVar2 = std::__cxx11::string::find((char *)length_local,0xb9cbf3), lVar2 != -1)) {
    this_local._7_1_ = 1;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    end = pcVar3;
    lVar2 = std::__cxx11::string::size();
    truncate = pcVar3 + lVar2;
    current = end + (long)begin;
    pcStack_48 = end;
    pcVar3 = pcStack_48;
    do {
      while( true ) {
        pcStack_48 = pcVar3;
        if (current <= pcStack_48) goto LAB_005d9204;
        local_58 = cm_utf8_decode_character(pcStack_48,truncate,(uint *)((long)&next + 4));
        if (local_58 != (char *)0x0) break;
        pcVar3 = pcStack_48 + 1;
      }
      pcVar3 = local_58;
    } while (local_58 <= current);
LAB_005d9204:
    std::__cxx11::string::substr((ulong)local_78,length_local);
    std::__cxx11::string::operator=((string *)length_local,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    poVar4 = std::operator<<((ostream *)local_1f0,
                             "...\nThe rest of the test output was removed since it exceeds the threshold of "
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)begin);
    std::operator<<(poVar4," bytes.\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator+=((string *)length_local,local_220);
    std::__cxx11::string::~string(local_220);
    this_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestTestHandler::CleanTestOutput(std::string& output, size_t length)
{
  if (!length || length >= output.size() ||
      output.find("CTEST_FULL_OUTPUT") != std::string::npos) {
    return true;
  }

  // Truncate at given length but do not break in the middle of a multi-byte
  // UTF-8 encoding.
  char const* const begin = output.c_str();
  char const* const end = begin + output.size();
  char const* const truncate = begin + length;
  char const* current = begin;
  while (current < truncate) {
    unsigned int ch;
    if (const char* next = cm_utf8_decode_character(current, end, &ch)) {
      if (next > truncate) {
        break;
      }
      current = next;
    } else // Bad byte will be handled by cmXMLWriter.
    {
      ++current;
    }
  }
  output = output.substr(0, current - begin);

  // Append truncation message.
  std::ostringstream msg;
  msg << "...\n"
         "The rest of the test output was removed since it exceeds the "
         "threshold "
         "of "
      << length << " bytes.\n";
  output += msg.str();
  return true;
}